

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O1

void __thiscall MTRand::seed(MTRand *this,uint32 *bigSeed,uint32 seedLength)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint32 *r;
  ulong uVar6;
  ulong uVar7;
  
  this->state[0] = 0x12bd6aa;
  uVar5 = 0x12bd6aa;
  lVar2 = 0;
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar2 + 1);
    this->state[lVar2 + 1] = uVar5;
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 0x26f);
  uVar5 = 0x270;
  if (0x270 < seedLength) {
    uVar5 = seedLength;
  }
  if ((int)uVar5 == 0) {
    iVar1 = 1;
  }
  else {
    iVar1 = 1;
    uVar6 = 0;
    do {
      uVar7 = (this->state[(long)iVar1 + -1] >> 0x1e ^ this->state[(long)iVar1 + -1]) * 0x19660d ^
              this->state[iVar1];
      this->state[iVar1] = uVar7;
      this->state[iVar1] = (ulong)(uint)((int)uVar7 + (int)bigSeed[uVar6] + (int)uVar6);
      if (iVar1 < 0x26f) {
        iVar1 = iVar1 + 1;
      }
      else {
        this->state[0] = this->state[0x26f];
        iVar1 = 1;
      }
      uVar6 = uVar6 + 1;
      if (seedLength <= uVar6) {
        uVar6 = 0;
      }
      uVar3 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar3;
    } while (uVar3 != 0);
  }
  iVar4 = -0x26f;
  do {
    this->state[iVar1] =
         (ulong)((((uint)(this->state[(long)iVar1 + -1] >> 0x1e) ^
                  (uint)this->state[(long)iVar1 + -1]) * 0x5d588b65 ^ (uint)this->state[iVar1]) -
                iVar1);
    if (iVar1 < 0x26f) {
      iVar1 = iVar1 + 1;
    }
    else {
      this->state[0] = this->state[0x26f];
      iVar1 = 1;
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0);
  this->state[0] = 0x80000000;
  reload(this);
  return;
}

Assistant:

void MTRand::initialize(const uint32 seed) {
  // Initialize generator state with seed
  // See Knuth TAOCP Vol 2, 3rd Ed, p.106 for multiplier.
  // In previous versions, most significant bits (MSBs) of the seed affect
  // only MSBs of the state array.  Modified 9 Jan 2002 by Makoto Matsumoto.
  uint32 *s = state;
  uint32 *r = state;
  int i = 1;
  *s++ = seed & 0xffffffffUL;
  for (; i < N; ++i) {
    *s++ = (1812433253UL * (*r ^ (*r >> 30)) + i) & 0xffffffffUL;
    r++;
  }
}